

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  undefined1 local_68 [8];
  CodedInputStream coded_input;
  
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_68,input);
  bVar1 = ParseFromCodedStream(this,(CodedInputStream *)local_68);
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_68);
  return (bool)(bVar1 & (byte)coded_input.overflow_bytes_);
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}